

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_dialer_set_tls(nng_dialer id,nng_tls_config *cfg)

{
  nni_dialer *local_28;
  nni_dialer *d;
  nng_tls_config *pnStack_18;
  int rv;
  nng_tls_config *cfg_local;
  nng_dialer id_local;
  
  pnStack_18 = cfg;
  cfg_local._0_4_ = id.id;
  d._4_4_ = nni_dialer_find(&local_28,id.id);
  cfg_local._4_4_ = d._4_4_;
  if (d._4_4_ == 0) {
    d._4_4_ = nni_dialer_set_tls(local_28,pnStack_18);
    nni_dialer_rele(local_28);
    cfg_local._4_4_ = d._4_4_;
  }
  return cfg_local._4_4_;
}

Assistant:

int
nng_dialer_set_tls(nng_dialer id, nng_tls_config *cfg)
{
	int         rv;
	nni_dialer *d;
	if ((rv = nni_dialer_find(&d, id.id)) != 0) {
		return (rv);
	}
	rv = nni_dialer_set_tls(d, cfg);
	nni_dialer_rele(d);
	return (rv);
}